

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O2

ReadFileResult
anon_unknown.dwarf_ce6936::TestPresetOutputTruncationHelper
          (optional<cmCTestTypes::TruncationMode> *out,Value *value)

{
  bool bVar1;
  _Optional_payload_base<cmCTestTypes::TruncationMode> _Var2;
  ReadFileResult RVar3;
  String SStack_48;
  
  if (value == (Value *)0x0) {
    RVar3 = READ_OK;
    if ((out->super__Optional_base<cmCTestTypes::TruncationMode,_true,_true>)._M_payload.
        super__Optional_payload_base<cmCTestTypes::TruncationMode>._M_engaged == true) {
      (out->super__Optional_base<cmCTestTypes::TruncationMode,_true,_true>)._M_payload.
      super__Optional_payload_base<cmCTestTypes::TruncationMode>._M_engaged = false;
    }
  }
  else {
    bVar1 = Json::Value::isString(value);
    RVar3 = INVALID_PRESET;
    if (bVar1) {
      Json::Value::asString_abi_cxx11_(&SStack_48,value);
      bVar1 = std::operator==(&SStack_48,"tail");
      std::__cxx11::string::~string((string *)&SStack_48);
      if (bVar1) {
        _Var2._M_payload = (_Storage<cmCTestTypes::TruncationMode,_true>)0x0;
        _Var2._M_engaged = true;
        _Var2._5_3_ = 0;
      }
      else {
        Json::Value::asString_abi_cxx11_(&SStack_48,value);
        bVar1 = std::operator==(&SStack_48,"middle");
        std::__cxx11::string::~string((string *)&SStack_48);
        if (bVar1) {
          _Var2._M_payload = (_Storage<cmCTestTypes::TruncationMode,_true>)0x1;
          _Var2._M_engaged = true;
          _Var2._5_3_ = 0;
        }
        else {
          Json::Value::asString_abi_cxx11_(&SStack_48,value);
          bVar1 = std::operator==(&SStack_48,"head");
          std::__cxx11::string::~string((string *)&SStack_48);
          if (!bVar1) {
            return INVALID_PRESET;
          }
          _Var2._M_payload = (_Storage<cmCTestTypes::TruncationMode,_true>)0x2;
          _Var2._M_engaged = true;
          _Var2._5_3_ = 0;
        }
      }
      (out->super__Optional_base<cmCTestTypes::TruncationMode,_true,_true>)._M_payload.
      super__Optional_payload_base<cmCTestTypes::TruncationMode> = _Var2;
      RVar3 = READ_OK;
    }
  }
  return RVar3;
}

Assistant:

ReadFileResult TestPresetOutputTruncationHelper(
  cm::optional<cmCTestTypes::TruncationMode>& out, const Json::Value* value)
{
  if (!value) {
    out = cm::nullopt;
    return ReadFileResult::READ_OK;
  }

  if (!value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "tail") {
    out = cmCTestTypes::TruncationMode::Tail;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "middle") {
    out = cmCTestTypes::TruncationMode::Middle;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "head") {
    out = cmCTestTypes::TruncationMode::Head;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}